

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::Decode
          (FundamentalParameterData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  FundamentalParameterData *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,(float *)&this->m_f32Freq);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32FreqRange);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32EffectiveRadiatedPower);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PulseRepetitionFreq);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PulseWidth);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BeamAzimuthCenter);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BeamAzimuthSweep);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BeamElevationCenter);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BeamElevationSweep);
  KDataStream::operator>>(pKVar2,(float *)&this->m_f32BeamSweepSync);
  return;
}

Assistant:

void FundamentalParameterData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FUNDAMENTAL_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32Freq
           >> m_f32FreqRange
           >> m_f32EffectiveRadiatedPower
           >> m_f32PulseRepetitionFreq
           >> m_f32PulseWidth
           >> m_f32BeamAzimuthCenter
           >> m_f32BeamAzimuthSweep
           >> m_f32BeamElevationCenter
           >> m_f32BeamElevationSweep
           >> m_f32BeamSweepSync;
}